

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O1

void __thiscall LogFile::LogFile(LogFile *this,string *filename)

{
  int iVar1;
  
  (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<char_*,_std::allocator<char_*>_>::_M_initialize_map
            ((_Deque_base<char_*,_std::allocator<char_*>_> *)this,0);
  (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->Wait_WriteTask).c.super__Deque_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<char_*,_std::allocator<char_*>_>::_M_initialize_map
            ((_Deque_base<char_*,_std::allocator<char_*>_> *)&this->Wait_WriteTask,0);
  pthread_mutex_init((pthread_mutex_t *)&this->put_Mutex,(pthread_mutexattr_t *)0x0);
  pthread_mutex_init((pthread_mutex_t *)&this->get_Mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->get_Cond,(pthread_condattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->Swap_Cond,(pthread_condattr_t *)0x0);
  iVar1 = open((filename->_M_dataplus)._M_p,0x442);
  this->fd = iVar1;
  if (-1 < iVar1) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"LofFile open fail",0x11)
  ;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MR-Wuhaha[P]WebServer/LogFile.cpp"
                ,0xd,"LogFile::LogFile(string)");
}

Assistant:

LogFile::LogFile(string filename)
{
    pthread_mutex_init(&put_Mutex,NULL);
    pthread_mutex_init(&get_Mutex,NULL);
    pthread_cond_init(&get_Cond,NULL);
    pthread_cond_init(&Swap_Cond,NULL);
    fd = open(filename.c_str(),O_RDWR | O_APPEND | O_CREAT);
    if(fd < 0)
    {
        cout<<"LofFile open fail"<<endl;
        assert(0);
    }
}